

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O2

void EBPLM::PredictStateOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *wmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  BCRec *bcrec;
  long lVar30;
  long lVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  EBCellFlag *pEVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  undefined8 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  int iVar79;
  int iVar80;
  bool bVar81;
  pair<bool,_bool> pVar82;
  pair<bool,_bool> pVar83;
  pair<bool,_bool> pVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  long lVar89;
  ulong uVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  Real (*paRVar121) [3];
  double *pdVar122;
  Real *pRVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  ulong uVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  long lVar140;
  long lVar141;
  char cVar142;
  int iVar143;
  double *pdVar144;
  int iVar145;
  char cVar146;
  long lVar147;
  double *pdVar148;
  int iVar149;
  int iVar150;
  long lVar151;
  long lVar152;
  double *pdVar153;
  double *pdVar154;
  int iVar155;
  long lVar156;
  long lVar157;
  int iVar158;
  long lVar159;
  long lVar160;
  int kk;
  int iVar161;
  long lVar162;
  long lVar163;
  int iVar164;
  long lVar165;
  long lVar166;
  int iVar167;
  long lVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  long lVar172;
  long lVar173;
  int jj_1;
  int iVar174;
  int iVar175;
  double *pdVar176;
  double *pdVar177;
  int cuts_x;
  int iVar178;
  int iVar179;
  int j;
  int iVar180;
  int iVar181;
  long lVar182;
  long lVar183;
  ulong uVar184;
  double dVar185;
  Real RVar186;
  double dVar187;
  double dVar188;
  ulong uVar189;
  undefined1 auVar190 [16];
  double dVar191;
  double dVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  Real delta_z;
  double dVar195;
  double dVar196;
  double dVar199;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  double dVar200;
  ulong uVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  Real delta_x;
  double dVar210;
  double dVar211;
  double dVar212;
  Real delta_y;
  double dVar213;
  double dVar214;
  double dVar215;
  double local_950;
  double *local_8f8;
  double *local_8b0;
  double *local_880;
  double *local_878;
  double *local_870;
  double *local_7d0;
  double *local_7c8;
  double *local_7c0;
  double local_798 [112];
  double local_418;
  double local_410;
  double dStack_408;
  double local_3f8;
  double dStack_3f0;
  double local_3d8;
  Real du [27];
  Real A [27] [3];
  
  dVar185 = dt / (geom->super_CoordSys).dx[1];
  iVar179 = (geom->domain).smallend.vect[0];
  iVar181 = (geom->domain).smallend.vect[1];
  iVar167 = (geom->domain).bigend.vect[0];
  iVar4 = (geom->domain).bigend.vect[1];
  iVar5 = (geom->domain).smallend.vect[2];
  iVar6 = (geom->domain).bigend.vect[2];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  pVar82 = anon_unknown.dwarf_5a37ad::has_extdir_or_ho(bcrec,ncomp,0);
  pVar83 = anon_unknown.dwarf_5a37ad::has_extdir_or_ho(bcrec,ncomp,1);
  pVar84 = anon_unknown.dwarf_5a37ad::has_extdir_or_ho(bcrec,ncomp,2);
  if ((((ushort)pVar82 & 1) == 0) || (iVar179 < (zebox->smallend).vect[0] + -1)) {
    iVar7 = (zebox->bigend).vect[0];
    if (((iVar7 < iVar167 || ((ushort)pVar82 >> 8 & 1) == 0) &&
        ((((ushort)pVar84 & 1) == 0 || (iVar5 < (zebox->smallend).vect[2] + -1)))) &&
       (((((ushort)pVar84 >> 8 & 1) == 0 || ((zebox->bigend).vect[2] < iVar6)) &&
        (((((ushort)pVar83 & 1) == 0 || (iVar181 < (zebox->smallend).vect[1] + -1)) &&
         ((((ushort)pVar83 >> 8 & 1) == 0 || ((zebox->bigend).vect[1] < iVar4)))))))) {
      lVar30 = ccc->nstride;
      if (ncomp < 1) {
        ncomp = 0;
      }
      iVar179 = (ccc->begin).z;
      lVar159 = (long)(zebox->smallend).vect[2];
      lVar31 = ccc->kstride;
      lVar127 = (~(long)iVar179 + lVar159) * lVar31;
      iVar181 = (zebox->smallend).vect[0];
      lVar89 = (long)iVar181;
      uVar8 = (ccc->begin).x;
      lVar128 = (long)(int)uVar8;
      iVar167 = (q->begin).z;
      lVar182 = (long)iVar167;
      lVar32 = q->kstride;
      iVar4 = (q->begin).x;
      lVar183 = (long)iVar4;
      pdVar33 = q->p;
      lVar34 = q->jstride;
      lVar35 = q->nstride;
      iVar5 = (q->begin).y;
      uVar90 = (ulong)iVar5;
      pdVar36 = wmac->p;
      lVar37 = wmac->jstride;
      lVar38 = wmac->kstride;
      lVar156 = (long)(wmac->begin).x;
      iVar6 = (wmac->begin).y;
      iVar7 = (wmac->begin).z;
      pdVar39 = Imz->p;
      lVar40 = Imz->jstride;
      lVar41 = Imz->kstride;
      lVar42 = Imz->nstride;
      iVar9 = (Imz->begin).x;
      iVar10 = (Imz->begin).y;
      iVar11 = (Imz->begin).z;
      pdVar43 = Ipz->p;
      lVar44 = Ipz->jstride;
      lVar45 = Ipz->kstride;
      lVar46 = Ipz->nstride;
      iVar12 = (Ipz->begin).x;
      iVar13 = (Ipz->begin).y;
      uVar14 = (Ipz->begin).z;
      pEVar47 = flag->p;
      lVar48 = flag->jstride;
      lVar49 = flag->kstride;
      iVar145 = (flag->begin).x;
      iVar15 = (flag->begin).y;
      lVar168 = (long)(flag->begin).z;
      pdVar50 = vfrac->p;
      lVar51 = vfrac->jstride;
      lVar52 = vfrac->kstride;
      uVar16 = (vfrac->begin).x;
      lVar129 = (long)(int)uVar16;
      uVar17 = (vfrac->begin).y;
      lVar136 = (long)(int)uVar17;
      iVar18 = (vfrac->begin).z;
      lVar169 = (long)iVar18;
      pdVar53 = ccc->p;
      lVar54 = ccc->jstride;
      iVar19 = (ccc->begin).y;
      pdVar55 = fcx->p;
      lVar56 = fcx->jstride;
      lVar57 = fcx->kstride;
      lVar58 = fcx->nstride;
      iVar20 = (fcx->begin).x;
      iVar21 = (fcx->begin).y;
      lVar170 = (long)(fcx->begin).z;
      pdVar59 = fcy->p;
      lVar60 = fcy->jstride;
      lVar61 = fcy->kstride;
      lVar62 = fcy->nstride;
      lVar171 = (long)(fcy->begin).x;
      iVar22 = (fcy->begin).y;
      lVar172 = (long)(fcy->begin).z;
      pdVar63 = fcz->p;
      lVar64 = fcz->jstride;
      lVar65 = fcz->kstride;
      lVar66 = fcz->nstride;
      lVar173 = (long)(fcz->begin).x;
      iVar23 = (fcz->begin).y;
      iVar24 = (fcz->begin).z;
      iVar25 = (zebox->smallend).vect[1];
      iVar26 = (zebox->bigend).vect[0];
      iVar27 = (zebox->bigend).vect[1];
      iVar28 = (zebox->bigend).vect[2];
      uVar135 = 0;
      local_8b0 = pdVar33 + ((((lVar159 - lVar182) + -2) * lVar32 + lVar89 + -1) - lVar183);
      do {
        if (uVar135 == (uint)ncomp) {
          return;
        }
        lVar137 = uVar135 * lVar35;
        local_8f8 = local_8b0;
        lVar130 = lVar159;
        local_880 = pdVar53 + ((lVar30 * 2 + lVar127 + lVar89 + -1) - lVar128);
        local_878 = pdVar53 + ((lVar30 + lVar127 + lVar89 + -1) - lVar128);
        local_870 = pdVar53 + ((lVar127 + lVar89 + -1) - lVar128);
        while (lVar130 <= iVar28) {
          lVar1 = lVar130 + -1;
          lVar119 = lVar130 + -2;
          lVar2 = lVar130 + 1;
          lVar91 = (lVar130 - lVar169) * lVar52;
          lVar92 = (lVar1 - lVar169) * lVar52;
          lVar93 = (lVar119 - lVar169) * lVar52;
          lVar94 = (lVar2 - lVar169) * lVar52;
          lVar95 = (lVar130 - lVar182) * lVar32;
          lVar138 = (lVar130 - iVar7) * lVar38;
          lVar96 = (lVar1 - lVar182) * lVar32;
          lVar97 = (lVar2 - lVar182) * lVar32;
          lVar98 = (lVar119 - lVar182) * lVar32;
          lVar99 = (lVar130 - iVar24) * lVar65;
          lVar100 = (lVar130 - iVar179) * lVar31;
          iVar124 = (int)lVar130;
          iVar85 = iVar124 - iVar167;
          lVar101 = iVar85 * lVar32;
          lVar102 = (lVar130 - lVar172) * lVar61;
          lVar103 = (lVar130 - lVar170) * lVar57;
          iVar158 = (int)lVar2;
          lVar104 = (iVar158 - iVar18) * lVar52;
          lVar105 = ((int)lVar119 - iVar18) * lVar52;
          lVar151 = ((int)lVar119 - iVar167) * lVar32;
          iVar86 = (int)lVar1 - iVar179;
          iVar87 = (int)lVar1 - iVar167;
          lVar106 = iVar87 * lVar32;
          lVar107 = (lVar1 - lVar172) * lVar61;
          lVar108 = (lVar1 - lVar170) * lVar57;
          lVar119 = (long)iVar25;
          while (lVar119 <= iVar27) {
            if (iVar26 < iVar181) {
              lVar119 = lVar119 + 1;
            }
            else {
              lVar109 = (lVar119 - iVar15) * lVar48;
              lVar110 = (lVar119 - lVar136) * lVar51;
              lVar111 = (lVar119 - uVar90) * lVar34;
              lVar112 = (lVar119 - iVar6) * lVar37;
              lVar113 = (lVar119 - iVar23) * lVar64;
              lVar114 = (lVar119 - iVar19) * lVar54;
              iVar143 = (int)lVar119;
              iVar88 = iVar143 - iVar5;
              lVar115 = iVar88 * lVar34;
              lVar116 = ((lVar119 + -1) - lVar136) * lVar51;
              lVar3 = lVar119 + 1;
              lVar131 = (lVar3 - lVar136) * lVar51;
              lVar139 = ((lVar119 + -1) - uVar90) * lVar34;
              lVar147 = (lVar3 - uVar90) * lVar34;
              lVar152 = ((int)lVar3 - iVar22) * lVar60;
              lVar157 = (lVar119 - iVar22) * lVar60;
              lVar160 = (lVar119 - iVar21) * lVar56;
              lVar162 = (int)(~uVar17 + iVar143) * lVar51;
              lVar165 = (int)((int)lVar3 - uVar17) * lVar51;
              lVar117 = lVar119 - iVar13;
              lVar118 = lVar119 - iVar10;
              lVar132 = (~(long)iVar19 + lVar119) * lVar54 * 8;
              local_7c8 = (double *)((long)local_880 + lVar132);
              local_7d0 = (double *)((long)local_878 + lVar132);
              local_7c0 = (double *)(lVar132 + (long)local_870);
              pdVar144 = (double *)((lVar119 + ~uVar90) * lVar34 * 8 + (long)local_8f8);
              lVar132 = lVar89;
              iVar79 = iVar181 - iVar4;
              iVar80 = (iVar181 - iVar4) + -1;
              do {
                lVar119 = lVar132 - iVar145;
                uVar29 = pEVar47[lVar109 + lVar119 + (lVar130 - lVar168) * lVar49].flag;
                dVar210 = 0.0;
                dVar212 = 0.0;
                if ((uVar29 >> 9 & 1) != 0) {
                  lVar140 = lVar132 - lVar129;
                  dVar192 = pdVar50[lVar110 + lVar140 + lVar91];
                  iVar149 = (int)lVar132;
                  if ((((dVar192 != 1.0) || (NAN(dVar192))) ||
                      (pdVar50[lVar110 + lVar140 + lVar92] != 1.0)) ||
                     (NAN(pdVar50[lVar110 + lVar140 + lVar92]))) {
LAB_0040b69a:
                    lVar133 = lVar132 - lVar173;
                    dVar212 = pdVar63[lVar113 + lVar133 + lVar99];
                    dVar213 = (pdVar63 + lVar113 + lVar133 + lVar99)[lVar66];
                    lVar120 = lVar132 - lVar128;
                    dVar191 = pdVar53[lVar100 + lVar114 + lVar120 + lVar30 * 2];
                    dVar204 = pdVar53[lVar100 + lVar114 + lVar120];
                    dVar203 = pdVar53[lVar100 + lVar114 + lVar120 + lVar30];
                    iVar150 = iVar149 - iVar4;
                    lVar134 = (long)iVar150;
                    dVar196 = pdVar33[lVar115 + lVar134 + lVar101 + lVar137];
                    dVar206 = pdVar33[lVar115 + lVar134 + lVar96 + lVar137];
                    cVar146 = '\x05';
                    pdVar122 = local_7d0;
                    pdVar153 = local_7c0;
                    pdVar176 = local_7c8;
                    iVar155 = 0;
                    for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                      pdVar148 = pdVar122;
                      pdVar154 = pdVar153;
                      pdVar177 = pdVar176;
                      iVar164 = iVar155;
                      cVar142 = cVar146;
                      for (lVar141 = -1; iVar155 = iVar155 + 3, lVar141 != 2; lVar141 = lVar141 + 1)
                      {
                        lVar166 = (long)iVar164;
                        paRVar121 = A + lVar166;
                        iVar164 = iVar164 + 3;
                        for (lVar163 = 0; iVar155 - lVar166 != lVar163; lVar163 = lVar163 + 1) {
                          iVar125 = (int)lVar163 + -1;
                          if ((((int)lVar141 == 0 && (int)lVar120 == 0) && iVar125 == 0) ||
                             ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) == 0)) {
                            (*paRVar121)[0] = 0.0;
                            (*paRVar121)[1] = 0.0;
                            (*paRVar121)[2] = 0.0;
                          }
                          else {
                            dVar210 = pdVar148[lVar163];
                            (*paRVar121)[0] = (pdVar154[lVar163] + (double)iVar125) - dVar204;
                            (*paRVar121)[1] = (dVar210 + (double)(int)lVar141) - dVar203;
                            (*paRVar121)[2] = (pdVar177[lVar163] + (double)(int)lVar120) - dVar191;
                          }
                          paRVar121 = paRVar121 + 1;
                        }
                        pdVar177 = pdVar177 + lVar54;
                        pdVar148 = pdVar148 + lVar54;
                        pdVar154 = pdVar154 + lVar54;
                        cVar142 = cVar142 + '\x03';
                      }
                      pdVar176 = pdVar176 + lVar31;
                      pdVar122 = pdVar122 + lVar31;
                      pdVar153 = pdVar153 + lVar31;
                      cVar146 = cVar146 + '\t';
                      iVar155 = iVar164;
                    }
                    iVar155 = 0;
                    cVar146 = '\x05';
                    for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                      iVar164 = iVar155;
                      cVar142 = cVar146;
                      for (lVar141 = -1; iVar164 = iVar164 + 3, lVar141 != 2; lVar141 = lVar141 + 1)
                      {
                        lVar163 = (long)iVar155;
                        iVar155 = iVar155 + 3;
                        for (lVar166 = 0; iVar164 - lVar163 != lVar166; lVar166 = lVar166 + 1) {
                          RVar186 = 0.0;
                          if (((int)lVar166 != 1 || ((int)lVar141 != 0 || (int)lVar120 != 0)) &&
                             ((1 << (cVar142 + (char)lVar166 & 0x1fU) & uVar29) != 0)) {
                            RVar186 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                        (iVar88 + (int)lVar141) * lVar34 +
                                                        (long)(iVar80 + (int)lVar166)] - dVar196;
                          }
                          du[lVar163 + lVar166] = RVar186;
                        }
                        cVar142 = cVar142 + '\x03';
                      }
                      cVar146 = cVar146 + '\t';
                    }
                    pdVar122 = &local_418;
                    for (lVar120 = 0; lVar141 = -0x48, lVar120 != 3; lVar120 = lVar120 + 1) {
                      for (; lVar141 != 0; lVar141 = lVar141 + 0x18) {
                        *(undefined8 *)((long)pdVar122 + lVar141 + 0x48) = 0;
                      }
                      local_798[lVar120] = 0.0;
                      pdVar122 = pdVar122 + 1;
                    }
                    pRVar123 = A[0] + 2;
                    dVar210 = local_3d8;
                    dVar214 = dStack_3f0;
                    dVar215 = local_410;
                    dVar208 = local_798[0];
                    dVar209 = local_418;
                    dVar195 = local_3f8;
                    dVar199 = dStack_408;
                    dVar200 = local_798[1];
                    dVar202 = local_798[2];
                    for (lVar120 = 0; lVar120 != 0x1b; lVar120 = lVar120 + 1) {
                      dVar188 = (*(Real (*) [3])(pRVar123 + -2))[0];
                      dVar205 = pRVar123[-1];
                      dVar187 = *pRVar123;
                      dVar195 = dVar195 + dVar205 * pRVar123[-1];
                      dVar199 = dVar199 + dVar188 * *pRVar123;
                      dVar214 = dVar214 + dVar187 * dVar205;
                      dVar215 = dVar215 + dVar205 * dVar188;
                      dVar210 = dVar210 + dVar187 * dVar187;
                      dVar187 = du[lVar120];
                      dVar208 = dVar208 + dVar188 * dVar187;
                      dVar209 = dVar209 + dVar188 * dVar188;
                      dVar200 = dVar200 + dVar187 * pRVar123[-1];
                      dVar202 = dVar202 + dVar187 * *pRVar123;
                      pRVar123 = pRVar123 + 3;
                    }
                    dVar188 = dVar215 * dVar210 - dVar199 * dVar214;
                    dVar205 = dVar215 * dVar202 - dVar199 * dVar200;
                    dVar187 = dVar215 * dVar214 + dVar199 * -dVar195;
                    dVar211 = dVar210 * dVar195 - dVar214 * dVar214;
                    dVar210 = dVar210 * dVar200 - dVar214 * dVar202;
                    auVar193._0_8_ =
                         dVar199 * (dVar214 * dVar200 - dVar202 * dVar195) +
                         (dVar208 * dVar211 - dVar210 * dVar215);
                    auVar193._8_8_ = dVar199 * dVar205 + (dVar209 * dVar210 - dVar188 * dVar208);
                    dVar199 = dVar187 * dVar199 + (dVar211 * dVar209 - dVar188 * dVar215);
                    auVar194._8_8_ = dVar199;
                    auVar194._0_8_ = dVar199;
                    auVar194 = divpd(auVar193,auVar194);
                    dVar199 = (dVar187 * dVar208 +
                              ((dVar202 * dVar195 + -dVar200 * dVar214) * dVar209 -
                              dVar205 * dVar215)) / dVar199;
                    dVar214 = auVar194._0_8_;
                    dVar215 = auVar194._8_8_;
                    if ((dVar192 == 1.0) && (!NAN(dVar192))) {
                      if ((pdVar50[lVar110 + lVar91 + ((lVar132 + -1) - lVar129)] == 1.0) &&
                         (!NAN(pdVar50[lVar110 + lVar91 + ((lVar132 + -1) - lVar129)]))) {
                        if ((pdVar50[lVar110 + lVar91 + ((lVar132 + 1) - lVar129)] == 1.0) &&
                           (!NAN(pdVar50[lVar110 + lVar91 + ((lVar132 + 1) - lVar129)]))) {
                          dVar209 = dVar196 - pdVar33[lVar115 + lVar101 + lVar137 + ((lVar132 + -1)
                                                                                    - lVar183)];
                          dVar195 = pdVar33[lVar115 + lVar101 + lVar137 + ((lVar132 + 1) - lVar183)]
                                    - dVar196;
                          dVar209 = dVar209 + dVar209;
                          dVar195 = dVar195 + dVar195;
                          dVar210 = (pdVar33[lVar115 + lVar101 + lVar137 + ((lVar132 + 1) - lVar183)
                                            ] -
                                    pdVar33[lVar115 + lVar101 + lVar137 + ((lVar132 + -1) - lVar183)
                                           ]) * 0.5;
                          dVar208 = ABS(dVar209);
                          uVar184 = -(ulong)(0.0 < dVar210);
                          dVar210 = ABS(dVar210);
                          dVar214 = ABS(dVar195);
                          if (dVar208 <= dVar210) {
                            dVar210 = dVar208;
                          }
                          if (dVar210 <= dVar214) {
                            dVar214 = dVar210;
                          }
                          uVar189 = -(ulong)(0.0 < dVar209 * dVar195) & (ulong)dVar214;
                          dVar214 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) |
                                            uVar184 & uVar189);
                        }
                      }
                      if ((((pdVar50[lVar116 + lVar91 + lVar140] == 1.0) &&
                           (!NAN(pdVar50[lVar116 + lVar91 + lVar140]))) &&
                          (pdVar50[lVar131 + lVar91 + lVar140] == 1.0)) &&
                         (!NAN(pdVar50[lVar131 + lVar91 + lVar140]))) {
                        dVar209 = dVar196 - pdVar33[lVar139 + lVar101 + lVar137 + lVar134];
                        dVar195 = pdVar33[lVar147 + lVar101 + lVar137 + lVar134] - dVar196;
                        dVar209 = dVar209 + dVar209;
                        dVar195 = dVar195 + dVar195;
                        dVar215 = (pdVar33[lVar147 + lVar101 + lVar137 + lVar134] -
                                  pdVar33[lVar139 + lVar101 + lVar137 + lVar134]) * 0.5;
                        dVar208 = ABS(dVar209);
                        uVar184 = -(ulong)(0.0 < dVar215);
                        dVar215 = ABS(dVar215);
                        dVar210 = ABS(dVar195);
                        if (dVar208 <= dVar215) {
                          dVar215 = dVar208;
                        }
                        if (dVar215 <= dVar210) {
                          dVar210 = dVar215;
                        }
                        uVar189 = -(ulong)(0.0 < dVar209 * dVar195) & (ulong)dVar210;
                        dVar215 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) |
                                          uVar184 & uVar189);
                      }
                      if (((pdVar50[lVar110 + lVar140 + lVar92] == 1.0) &&
                          (!NAN(pdVar50[lVar110 + lVar140 + lVar92]))) &&
                         ((pdVar50[lVar110 + lVar140 + lVar94] == 1.0 &&
                          (!NAN(pdVar50[lVar110 + lVar140 + lVar94]))))) {
                        dVar195 = pdVar33[lVar115 + lVar134 + lVar97 + lVar137] - dVar196;
                        dVar209 = (dVar196 - dVar206) + (dVar196 - dVar206);
                        dVar195 = dVar195 + dVar195;
                        dVar208 = (pdVar33[lVar115 + lVar134 + lVar97 + lVar137] - dVar206) * 0.5;
                        dVar199 = ABS(dVar209);
                        uVar184 = -(ulong)(0.0 < dVar208);
                        dVar208 = ABS(dVar208);
                        dVar210 = ABS(dVar195);
                        if (dVar199 <= dVar208) {
                          dVar208 = dVar199;
                        }
                        if (dVar208 <= dVar210) {
                          dVar210 = dVar208;
                        }
                        uVar189 = -(ulong)(0.0 < dVar209 * dVar195) & (ulong)dVar210;
                        dVar199 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) |
                                          uVar184 & uVar189);
                      }
                    }
                    dVar210 = dVar206;
                    if (dVar196 <= dVar206) {
                      dVar210 = dVar196;
                    }
                    dVar213 = dVar213 - dVar203;
                    if (dVar206 <= dVar196) {
                      dVar206 = dVar196;
                    }
                    dVar212 = dVar212 - dVar204;
                    iVar126 = 0;
                    iVar164 = 0;
                    iVar155 = 0;
                    iVar178 = 0;
                    iVar125 = -1;
                    while (iVar125 != 2) {
                      iVar174 = iVar126;
                      iVar175 = -1;
                      while (iVar175 != 2) {
                        for (iVar161 = 5; iVar161 != 8; iVar161 = iVar161 + 1) {
                          if (((uVar29 >> (iVar161 + iVar174 & 0x1fU) & 1) != 0) &&
                             ((iVar161 != 6 || iVar175 != 0) || iVar125 != 0)) {
                            iVar178 = iVar178 + (uint)((iVar161 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar175 == 0 && iVar125 == 0));
                            iVar155 = iVar155 + (uint)((iVar161 == 6 && iVar125 == 0) &&
                                                      (iVar175 == 1 || iVar175 + 1 == 0));
                            iVar164 = iVar164 + (uint)((iVar161 == 6 && iVar175 == 0) &&
                                                      (iVar125 == 1 || iVar125 + 1 == 0));
                          }
                        }
                        iVar174 = iVar174 + 3;
                        iVar175 = iVar175 + 1;
                      }
                      iVar126 = iVar126 + 9;
                      iVar125 = iVar125 + 1;
                    }
                    dVar208 = 2.0;
                    if ((uVar29 >> 0x15 & 1) != 0) {
                      cVar146 = '\b';
                      dVar208 = dVar196;
                      dVar209 = dVar196;
                      for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                        cVar142 = cVar146;
                        for (lVar141 = 0; lVar141 != 2; lVar141 = lVar141 + 1) {
                          for (lVar163 = 0; lVar163 != 3; lVar163 = lVar163 + 1) {
                            if (((int)lVar163 != 1 || ((int)lVar141 != 0 || (int)lVar120 != 0)) &&
                               ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                              dVar195 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                          (iVar88 + (int)lVar141) * lVar34 +
                                                          (long)(iVar80 + (int)lVar163)];
                              dVar200 = dVar195;
                              if (dVar195 <= dVar208) {
                                dVar200 = dVar208;
                              }
                              dVar208 = dVar200;
                              if (dVar195 < dVar209) {
                                dVar209 = dVar195;
                              }
                            }
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar195 = (((pdVar59 + lVar152 + lVar102 + (lVar132 - lVar171))[lVar62] -
                                 dVar191) * dVar199 +
                                (0.5 - dVar203) * dVar215 +
                                (pdVar59[lVar152 + lVar102 + (lVar132 - lVar171)] - dVar204) *
                                dVar214 + dVar196) - dVar196;
                      if (dVar195 <= 1e-13) {
                        dVar208 = 1.0;
                        if ((dVar195 < -1e-13) &&
                           (dVar208 = (dVar209 - dVar196) / dVar195, 1.0 <= dVar208)) {
                          dVar208 = 1.0;
                        }
                      }
                      else {
                        dVar208 = (dVar208 - dVar196) / dVar195;
                        if (1.0 <= dVar208) {
                          dVar208 = 1.0;
                        }
                      }
                      if (2.0 <= dVar208) {
                        dVar208 = 2.0;
                      }
                    }
                    dVar209 = dVar208;
                    if ((short)uVar29 < 0) {
                      cVar146 = '\x05';
                      dVar195 = dVar196;
                      dVar209 = dVar196;
                      for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                        cVar142 = cVar146;
                        for (lVar141 = -1; lVar141 != 1; lVar141 = lVar141 + 1) {
                          for (lVar163 = 0; lVar163 != 3; lVar163 = lVar163 + 1) {
                            if (((int)lVar163 != 1 || ((int)lVar141 != 0 || (int)lVar120 != 0)) &&
                               ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                              dVar200 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                          (iVar88 + (int)lVar141) * lVar34 +
                                                          (long)(iVar80 + (int)lVar163)];
                              dVar202 = dVar200;
                              if (dVar200 <= dVar209) {
                                dVar202 = dVar209;
                              }
                              dVar209 = dVar202;
                              if (dVar200 < dVar195) {
                                dVar195 = dVar200;
                              }
                            }
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar200 = (((pdVar59 + lVar157 + lVar102 + (lVar132 - lVar171))[lVar62] -
                                 dVar191) * dVar199 +
                                (((pdVar59[lVar157 + lVar102 + (lVar132 - lVar171)] - dVar204) *
                                  dVar214 + dVar196) - (dVar203 + 0.5) * dVar215)) - dVar196;
                      if (dVar200 <= 1e-13) {
                        dVar209 = 1.0;
                        if ((dVar200 < -1e-13) &&
                           (dVar209 = (dVar195 - dVar196) / dVar200, 1.0 <= dVar209)) {
                          dVar209 = 1.0;
                        }
                      }
                      else {
                        dVar209 = (dVar209 - dVar196) / dVar200;
                        if (1.0 <= dVar209) {
                          dVar209 = 1.0;
                        }
                      }
                      if (dVar208 <= dVar209) {
                        dVar209 = dVar208;
                      }
                    }
                    dVar208 = dVar209;
                    if ((uVar29 >> 0x13 & 1) != 0) {
                      cVar146 = '\x06';
                      dVar195 = dVar196;
                      dVar208 = dVar196;
                      for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                        cVar142 = cVar146;
                        for (lVar141 = -1; lVar141 != 2; lVar141 = lVar141 + 1) {
                          for (lVar163 = 0; lVar163 != 2; lVar163 = lVar163 + 1) {
                            dVar200 = dVar195;
                            if ((((int)lVar141 != 0 || (int)lVar120 != 0) || (int)lVar163 != 0) &&
                               ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                              dVar200 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                          (iVar88 + (int)lVar141) * lVar34 +
                                                          (long)(iVar79 + (int)lVar163)];
                              dVar202 = dVar200;
                              if (dVar200 <= dVar208) {
                                dVar202 = dVar208;
                              }
                              dVar208 = dVar202;
                              if (dVar195 <= dVar200) {
                                dVar200 = dVar195;
                              }
                            }
                            dVar195 = dVar200;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar200 = (((pdVar55 + lVar160 + lVar103 + ((iVar149 - iVar20) + 1))[lVar58] -
                                 dVar191) * dVar199 +
                                (pdVar55[lVar160 + lVar103 + ((iVar149 - iVar20) + 1)] - dVar203) *
                                dVar215 + (0.5 - dVar204) * dVar214 + dVar196) - dVar196;
                      if (dVar200 <= 1e-13) {
                        dVar208 = 1.0;
                        if ((dVar200 < -1e-13) &&
                           (dVar208 = (dVar195 - dVar196) / dVar200, 1.0 <= dVar208)) {
                          dVar208 = 1.0;
                        }
                      }
                      else {
                        dVar208 = (dVar208 - dVar196) / dVar200;
                        if (1.0 <= dVar208) {
                          dVar208 = 1.0;
                        }
                      }
                      if (dVar209 <= dVar208) {
                        dVar208 = dVar209;
                      }
                    }
                    dVar209 = dVar208;
                    if ((uVar29 >> 0x11 & 1) != 0) {
                      cVar146 = '\x05';
                      dVar195 = dVar196;
                      dVar209 = dVar196;
                      for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                        cVar142 = cVar146;
                        for (lVar141 = -1; lVar141 != 2; lVar141 = lVar141 + 1) {
                          for (lVar163 = 0; lVar163 != 2; lVar163 = lVar163 + 1) {
                            dVar200 = dVar195;
                            if (((int)lVar163 != 1 || ((int)lVar141 != 0 || (int)lVar120 != 0)) &&
                               ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                              dVar200 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                          (iVar88 + (int)lVar141) * lVar34 +
                                                          (long)(iVar80 + (int)lVar163)];
                              dVar202 = dVar200;
                              if (dVar200 <= dVar209) {
                                dVar202 = dVar209;
                              }
                              dVar209 = dVar202;
                              if (dVar195 <= dVar200) {
                                dVar200 = dVar195;
                              }
                            }
                            dVar195 = dVar200;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar200 = (((pdVar55 + lVar160 + lVar103 + (lVar132 - iVar20))[lVar58] -
                                 dVar191) * dVar199 +
                                (pdVar55[lVar160 + lVar103 + (lVar132 - iVar20)] - dVar203) *
                                dVar215 + (dVar196 - (dVar204 + 0.5) * dVar214)) - dVar196;
                      if (dVar200 <= 1e-13) {
                        dVar209 = 1.0;
                        if ((dVar200 < -1e-13) &&
                           (dVar209 = (dVar195 - dVar196) / dVar200, 1.0 <= dVar209)) {
                          dVar209 = 1.0;
                        }
                      }
                      else {
                        dVar209 = (dVar209 - dVar196) / dVar200;
                        if (1.0 <= dVar209) {
                          dVar209 = 1.0;
                        }
                      }
                      if (dVar208 <= dVar209) {
                        dVar209 = dVar208;
                      }
                    }
                    dVar208 = dVar209;
                    if ((uVar29 >> 0x1b & 1) != 0) {
                      cVar146 = '\x0e';
                      dVar195 = dVar196;
                      dVar208 = dVar196;
                      for (lVar120 = 0; lVar120 != 2; lVar120 = lVar120 + 1) {
                        cVar142 = cVar146;
                        for (lVar141 = -1; lVar141 != 2; lVar141 = lVar141 + 1) {
                          for (lVar163 = 0; lVar163 != 3; lVar163 = lVar163 + 1) {
                            dVar200 = dVar195;
                            if (((int)lVar163 != 1 || ((int)lVar141 != 0 || (int)lVar120 != 0)) &&
                               ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                              dVar200 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                          (iVar88 + (int)lVar141) * lVar34 +
                                                          (long)(iVar80 + (int)lVar163)];
                              dVar202 = dVar200;
                              if (dVar200 <= dVar208) {
                                dVar202 = dVar208;
                              }
                              dVar208 = dVar202;
                              if (dVar195 <= dVar200) {
                                dVar200 = dVar195;
                              }
                            }
                            dVar195 = dVar200;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar204 = ((0.5 - dVar191) * dVar199 +
                                ((pdVar63 + lVar113 + lVar133 + (iVar158 - iVar24) * lVar65)[lVar66]
                                - dVar203) * dVar215 +
                                (pdVar63[lVar113 + lVar133 + (iVar158 - iVar24) * lVar65] - dVar204)
                                * dVar214 + dVar196) - dVar196;
                      if (dVar204 <= 1e-13) {
                        dVar208 = 1.0;
                        if ((dVar204 < -1e-13) &&
                           (dVar208 = (dVar195 - dVar196) / dVar204, 1.0 <= dVar208)) {
                          dVar208 = 1.0;
                        }
                      }
                      else {
                        dVar208 = (dVar208 - dVar196) / dVar204;
                        if (1.0 <= dVar208) {
                          dVar208 = 1.0;
                        }
                      }
                      if (dVar209 <= dVar208) {
                        dVar208 = dVar209;
                      }
                    }
                    cVar146 = '\x05';
                    dVar204 = dVar196;
                    dVar203 = dVar196;
                    for (lVar120 = -1; lVar120 != 1; lVar120 = lVar120 + 1) {
                      cVar142 = cVar146;
                      for (lVar141 = -1; lVar141 != 2; lVar141 = lVar141 + 1) {
                        for (lVar163 = 0; lVar163 != 3; lVar163 = lVar163 + 1) {
                          dVar209 = dVar204;
                          if (((int)lVar163 != 1 || ((int)lVar141 != 0 || (int)lVar120 != 0)) &&
                             ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                            dVar209 = pdVar33[lVar137 + (iVar85 + (int)lVar120) * lVar32 +
                                                        (iVar88 + (int)lVar141) * lVar34 +
                                                        (long)(iVar80 + (int)lVar163)];
                            dVar195 = dVar209;
                            if (dVar209 <= dVar203) {
                              dVar195 = dVar203;
                            }
                            dVar203 = dVar195;
                            if (dVar204 <= dVar209) {
                              dVar209 = dVar204;
                            }
                          }
                          dVar204 = dVar209;
                        }
                        cVar142 = cVar142 + '\x03';
                      }
                      cVar146 = cVar146 + '\t';
                    }
                    dVar209 = ((dVar213 * dVar215 + dVar212 * dVar214 + dVar196) -
                              (dVar191 + 0.5) * dVar199) - dVar196;
                    if (dVar209 <= 1e-13) {
                      dVar203 = 1.0;
                      if ((dVar209 < -1e-13) &&
                         (dVar203 = (dVar204 - dVar196) / dVar209, 1.0 <= dVar203)) {
                        dVar203 = 1.0;
                      }
                    }
                    else {
                      dVar203 = (dVar203 - dVar196) / dVar209;
                      if (1.0 <= dVar203) {
                        dVar203 = 1.0;
                      }
                    }
                    if (dVar208 <= dVar203) {
                      dVar203 = dVar208;
                    }
                    dVar204 = 0.0;
                    if (1 < iVar178) {
                      dVar204 = dVar203;
                    }
                    dVar208 = 0.0;
                    if (1 < iVar155) {
                      dVar208 = dVar203;
                    }
                    dVar209 = 0.0;
                    if (1 < iVar164) {
                      dVar209 = dVar203;
                    }
                    if ((dVar192 != 1.0) || (NAN(dVar192))) {
                      local_950 = pdVar50[lVar110 + lVar140 + lVar92];
                    }
                    else {
                      if ((((pdVar50[lVar110 + lVar91 + (int)(~uVar16 + iVar149)] == 1.0) &&
                           (!NAN(pdVar50[lVar110 + lVar91 + (int)(~uVar16 + iVar149)]))) &&
                          (pdVar50[lVar110 + lVar91 + (int)((iVar149 - uVar16) + 1)] == 1.0)) &&
                         (!NAN(pdVar50[lVar110 + lVar91 + (int)((iVar149 - uVar16) + 1)]))) {
                        dVar204 = 1.0;
                      }
                      if (((pdVar50[lVar162 + lVar91 + lVar140] == 1.0) &&
                          (!NAN(pdVar50[lVar162 + lVar91 + lVar140]))) &&
                         ((pdVar50[lVar165 + lVar91 + lVar140] == 1.0 &&
                          (!NAN(pdVar50[lVar165 + lVar91 + lVar140]))))) {
                        dVar208 = 1.0;
                      }
                      local_950 = pdVar50[lVar110 + lVar140 + lVar92];
                      if ((local_950 == 1.0) && (!NAN(local_950))) {
                        if ((pdVar50[lVar110 + lVar140 + lVar104] != 1.0) ||
                           (NAN(pdVar50[lVar110 + lVar140 + lVar104]))) {
                          local_950 = 1.0;
                        }
                        else {
                          local_950 = 1.0;
                          dVar209 = 1.0;
                        }
                      }
                    }
                    dVar212 = dVar213 * dVar215 * dVar208 +
                              dVar212 * dVar214 * dVar204 +
                              -(dVar191 + 0.5) * dVar199 * dVar209 + dVar196;
                    if (dVar212 <= dVar206) {
                      dVar206 = dVar212;
                    }
                    if (dVar210 <= dVar206) {
                      dVar210 = dVar206;
                    }
                    dVar210 = pdVar36[lVar138 + lVar112 + (lVar132 - lVar156)] * dVar185 * -0.5 *
                              dVar199 * dVar209 + dVar210;
                    if ((local_950 == 1.0) && (!NAN(local_950))) goto LAB_0040ceff;
                    bVar81 = false;
LAB_0040d30a:
                    dVar213 = pdVar63[lVar113 + lVar133 + lVar99];
                    dVar191 = (pdVar63 + lVar113 + lVar133 + lVar99)[lVar66];
                    pdVar122 = pdVar53 + iVar86 * lVar31 +
                                         (iVar143 - iVar19) * lVar54 + (long)(int)(iVar149 - uVar8);
                    dVar204 = pdVar122[lVar30 * 2];
                    dVar203 = *pdVar122;
                    dVar196 = pdVar122[lVar30];
                    dVar206 = pdVar33[lVar115 + lVar134 + lVar95 + lVar137];
                    dVar214 = pdVar33[lVar115 + lVar134 + lVar106 + lVar137];
                    uVar29 = pEVar47[lVar109 + lVar119 + (lVar1 - lVar168) * lVar49].flag;
                    cVar146 = '\x05';
                    iVar155 = 0;
                    for (lVar119 = -1; lVar119 != 2; lVar119 = lVar119 + 1) {
                      iVar125 = (int)lVar119;
                      iVar164 = iVar155;
                      cVar142 = cVar146;
                      for (lVar120 = -1; iVar155 = iVar155 + 3, lVar120 != 2; lVar120 = lVar120 + 1)
                      {
                        lVar141 = (long)iVar164;
                        paRVar121 = A + lVar141;
                        iVar126 = (int)lVar120;
                        iVar164 = iVar164 + 3;
                        for (lVar163 = 0; iVar155 - lVar141 != lVar163; lVar163 = lVar163 + 1) {
                          iVar178 = (int)lVar163 + -1;
                          if (((iVar126 == 0 && iVar125 == 0) && iVar178 == 0) ||
                             ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) == 0)) {
                            (*paRVar121)[0] = 0.0;
                            (*paRVar121)[1] = 0.0;
                            (*paRVar121)[2] = 0.0;
                          }
                          else {
                            pdVar122 = pdVar53 + (iVar86 + iVar125) * lVar31 +
                                                 ((iVar143 - iVar19) + iVar126) * lVar54 +
                                                 (long)(int)(~uVar8 + iVar149 + (int)lVar163);
                            dVar212 = pdVar122[lVar30];
                            (*paRVar121)[0] = (*pdVar122 + (double)iVar178) - dVar203;
                            (*paRVar121)[1] = (dVar212 + (double)iVar126) - dVar196;
                            (*paRVar121)[2] = (pdVar122[lVar30 * 2] + (double)iVar125) - dVar204;
                          }
                          paRVar121 = paRVar121 + 1;
                        }
                        cVar142 = cVar142 + '\x03';
                      }
                      cVar146 = cVar146 + '\t';
                      iVar155 = iVar164;
                    }
                    iVar155 = iVar150 + -1;
                    iVar164 = 0;
                    cVar146 = '\x05';
                    for (lVar119 = -1; lVar119 != 2; lVar119 = lVar119 + 1) {
                      iVar125 = iVar164;
                      cVar142 = cVar146;
                      for (lVar120 = -1; iVar125 = iVar125 + 3, lVar120 != 2; lVar120 = lVar120 + 1)
                      {
                        lVar141 = (long)iVar164;
                        iVar164 = iVar164 + 3;
                        for (lVar163 = 0; iVar125 - lVar141 != lVar163; lVar163 = lVar163 + 1) {
                          RVar186 = 0.0;
                          if (((int)lVar163 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                             ((1 << (cVar142 + (char)lVar163 & 0x1fU) & uVar29) != 0)) {
                            RVar186 = pdVar33[lVar137 + (iVar87 + (int)lVar119) * lVar32 +
                                                        (iVar88 + (int)lVar120) * lVar34 +
                                                        (long)(iVar155 + (int)lVar163)] - dVar214;
                          }
                          du[lVar141 + lVar163] = RVar186;
                        }
                        cVar142 = cVar142 + '\x03';
                      }
                      cVar146 = cVar146 + '\t';
                    }
                    pdVar122 = &local_418;
                    for (lVar119 = 0; lVar120 = -0x48, lVar119 != 3; lVar119 = lVar119 + 1) {
                      for (; lVar120 != 0; lVar120 = lVar120 + 0x18) {
                        *(undefined8 *)((long)pdVar122 + lVar120 + 0x48) = 0;
                      }
                      local_798[lVar119] = 0.0;
                      pdVar122 = pdVar122 + 1;
                    }
                    pRVar123 = A[0] + 2;
                    dVar212 = local_418;
                    dVar215 = local_798[0];
                    dVar208 = dStack_408;
                    dVar209 = local_410;
                    dVar195 = local_798[1];
                    dVar199 = local_798[2];
                    dVar200 = local_3d8;
                    dVar202 = local_3f8;
                    dVar187 = dStack_3f0;
                    for (lVar119 = 0; lVar119 != 0x1b; lVar119 = lVar119 + 1) {
                      dVar211 = (*(Real (*) [3])(pRVar123 + -2))[0];
                      dVar207 = pRVar123[-1];
                      dVar188 = du[lVar119];
                      dVar212 = dVar212 + dVar211 * dVar211;
                      dVar202 = dVar202 + dVar207 * pRVar123[-1];
                      dVar187 = dVar187 + dVar207 * *pRVar123;
                      dVar205 = *pRVar123;
                      dVar215 = dVar215 + dVar211 * dVar188;
                      dVar208 = dVar208 + dVar211 * dVar205;
                      dVar209 = dVar209 + dVar207 * dVar211;
                      dVar195 = dVar195 + dVar188 * dVar207;
                      dVar199 = dVar199 + dVar205 * dVar188;
                      dVar200 = dVar200 + dVar205 * dVar205;
                      pRVar123 = pRVar123 + 3;
                    }
                    dVar205 = dVar200 * dVar209 + -dVar187 * dVar208;
                    dVar207 = dVar202 * dVar200 - dVar187 * dVar187;
                    dVar211 = dVar209 * dVar187 - dVar202 * dVar208;
                    dVar188 = dVar209 * dVar199 - dVar208 * dVar195;
                    dVar200 = dVar200 * dVar195 - dVar199 * dVar187;
                    auVar197._0_8_ =
                         dVar215 * dVar211 +
                         (dVar212 * (dVar202 * dVar199 - dVar187 * dVar195) - dVar209 * dVar188);
                    auVar197._8_8_ =
                         dVar208 * (dVar195 * dVar187 - dVar202 * dVar199) +
                         (dVar215 * dVar207 - dVar209 * dVar200);
                    dVar209 = dVar211 * dVar208 + (dVar207 * dVar212 - dVar205 * dVar209);
                    auVar190._8_8_ = dVar209;
                    auVar190._0_8_ = dVar209;
                    dVar209 = (dVar188 * dVar208 + (dVar200 * dVar212 - dVar205 * dVar215)) /
                              dVar209;
                    auVar198 = divpd(auVar197,auVar190);
                    if (bVar81) {
                      uVar184 = auVar198._8_8_;
                      if ((pdVar50[lVar110 + lVar92 + ((lVar132 + -1) - lVar129)] == 1.0) &&
                         (!NAN(pdVar50[lVar110 + lVar92 + ((lVar132 + -1) - lVar129)]))) {
                        if ((pdVar50[lVar110 + lVar92 + ((lVar132 + 1) - lVar129)] == 1.0) &&
                           (!NAN(pdVar50[lVar110 + lVar92 + ((lVar132 + 1) - lVar129)]))) {
                          dVar208 = dVar214 - pdVar33[lVar115 + lVar106 + lVar137 + ((lVar132 + -1)
                                                                                    - lVar183)];
                          dVar195 = pdVar33[lVar115 + lVar106 + lVar137 + ((lVar132 + 1) - lVar183)]
                                    - dVar214;
                          dVar208 = dVar208 + dVar208;
                          dVar195 = dVar195 + dVar195;
                          dVar212 = (pdVar33[lVar115 + lVar106 + lVar137 + ((lVar132 + 1) - lVar183)
                                            ] -
                                    pdVar33[lVar115 + lVar106 + lVar137 + ((lVar132 + -1) - lVar183)
                                           ]) * 0.5;
                          dVar199 = ABS(dVar208);
                          uVar184 = -(ulong)(0.0 < dVar212);
                          dVar212 = ABS(dVar212);
                          dVar215 = ABS(dVar195);
                          if (dVar199 <= dVar212) {
                            dVar212 = dVar199;
                          }
                          if (dVar212 <= dVar215) {
                            dVar215 = dVar212;
                          }
                          uVar189 = -(ulong)(0.0 < dVar208 * dVar195) & (ulong)dVar215;
                          uVar184 = ~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189;
                        }
                      }
                      if ((((pdVar50[lVar116 + lVar92 + lVar140] == 1.0) &&
                           (!NAN(pdVar50[lVar116 + lVar92 + lVar140]))) &&
                          (pdVar50[lVar131 + lVar92 + lVar140] == 1.0)) &&
                         (!NAN(pdVar50[lVar131 + lVar92 + lVar140]))) {
                        dVar208 = dVar214 - pdVar33[lVar139 + lVar106 + lVar137 + lVar134];
                        dVar209 = pdVar33[lVar147 + lVar106 + lVar137 + lVar134] - dVar214;
                        dVar208 = dVar208 + dVar208;
                        dVar209 = dVar209 + dVar209;
                        dVar212 = (pdVar33[lVar147 + lVar106 + lVar137 + lVar134] -
                                  pdVar33[lVar139 + lVar106 + lVar137 + lVar134]) * 0.5;
                        dVar195 = ABS(dVar208);
                        uVar189 = -(ulong)(0.0 < dVar212);
                        dVar212 = ABS(dVar212);
                        dVar215 = ABS(dVar209);
                        if (dVar195 <= dVar212) {
                          dVar212 = dVar195;
                        }
                        if (dVar212 <= dVar215) {
                          dVar215 = dVar212;
                        }
                        uVar201 = -(ulong)(0.0 < dVar208 * dVar209) & (ulong)dVar215;
                        dVar209 = (double)(~uVar189 & (uVar201 ^ 0x8000000000000000) |
                                          uVar189 & uVar201);
                      }
                      auVar198._8_8_ = uVar184;
                      if (((dVar192 == 1.0) && (!NAN(dVar192))) &&
                         ((pdVar50[lVar110 + lVar140 + lVar93] == 1.0 &&
                          (!NAN(pdVar50[lVar110 + lVar140 + lVar93]))))) {
                        dVar195 = dVar214 - pdVar33[lVar115 + lVar134 + lVar98 + lVar137];
                        dVar208 = (dVar206 - dVar214) + (dVar206 - dVar214);
                        dVar195 = dVar195 + dVar195;
                        dVar212 = (dVar206 - pdVar33[lVar115 + lVar134 + lVar98 + lVar137]) * 0.5;
                        dVar199 = ABS(dVar195);
                        uVar189 = -(ulong)(0.0 < dVar212);
                        dVar212 = ABS(dVar212);
                        dVar215 = ABS(dVar208);
                        if (dVar199 <= dVar212) {
                          dVar212 = dVar199;
                        }
                        if (dVar212 <= dVar215) {
                          dVar215 = dVar212;
                        }
                        uVar201 = -(ulong)(0.0 < dVar195 * dVar208) & (ulong)dVar215;
                        auVar198._0_8_ =
                             ~uVar189 & (uVar201 ^ 0x8000000000000000) | uVar189 & uVar201;
                      }
                    }
                    dVar212 = dVar214;
                    if (dVar206 <= dVar214) {
                      dVar212 = dVar206;
                    }
                    dVar191 = dVar191 - dVar196;
                    dVar215 = dVar214;
                    if (dVar214 <= dVar206) {
                      dVar215 = dVar206;
                    }
                    dVar213 = dVar213 - dVar203;
                    iVar178 = 0;
                    iVar174 = 0;
                    iVar125 = 0;
                    iVar164 = 0;
                    iVar126 = -1;
                    while (iVar126 != 2) {
                      iVar175 = iVar178;
                      iVar161 = -1;
                      while (iVar161 != 2) {
                        for (iVar180 = 5; iVar180 != 8; iVar180 = iVar180 + 1) {
                          if (((uVar29 >> (iVar180 + iVar175 & 0x1fU) & 1) != 0) &&
                             ((iVar180 != 6 || iVar161 != 0) || iVar126 != 0)) {
                            iVar164 = iVar164 + (uint)((iVar180 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar161 == 0 && iVar126 == 0));
                            iVar125 = iVar125 + (uint)((iVar180 == 6 && iVar126 == 0) &&
                                                      (iVar161 == 1 || iVar161 + 1 == 0));
                            iVar174 = iVar174 + (uint)((iVar180 == 6 && iVar161 == 0) &&
                                                      (iVar126 == 1 || iVar126 + 1 == 0));
                          }
                        }
                        iVar175 = iVar175 + 3;
                        iVar161 = iVar161 + 1;
                      }
                      iVar178 = iVar178 + 9;
                      iVar126 = iVar126 + 1;
                    }
                    dVar195 = auVar198._8_8_;
                    dVar206 = 2.0;
                    dVar208 = auVar198._0_8_;
                    if ((uVar29 >> 0x15 & 1) != 0) {
                      cVar146 = '\b';
                      dVar206 = dVar214;
                      dVar199 = dVar214;
                      for (lVar119 = -1; lVar119 != 2; lVar119 = lVar119 + 1) {
                        cVar142 = cVar146;
                        for (lVar120 = 0; lVar120 != 2; lVar120 = lVar120 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            if (((int)lVar134 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                               ((1 << ((char)lVar134 + cVar142 & 0x1fU) & uVar29) != 0)) {
                              dVar200 = pdVar33[lVar137 + (iVar87 + (int)lVar119) * lVar32 +
                                                          (iVar88 + (int)lVar120) * lVar34 +
                                                          (long)(iVar155 + (int)lVar134)];
                              dVar202 = dVar200;
                              if (dVar200 <= dVar206) {
                                dVar202 = dVar206;
                              }
                              dVar206 = dVar202;
                              if (dVar200 < dVar199) {
                                dVar199 = dVar200;
                              }
                            }
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar200 = (((pdVar59 + lVar152 + lVar107 + (lVar132 - lVar171))[lVar62] -
                                 dVar204) * dVar208 +
                                (0.5 - dVar196) * dVar209 +
                                (pdVar59[lVar152 + lVar107 + (lVar132 - lVar171)] - dVar203) *
                                dVar195 + dVar214) - dVar214;
                      if (dVar200 <= 1e-13) {
                        dVar206 = 1.0;
                        if ((dVar200 < -1e-13) &&
                           (dVar206 = (dVar199 - dVar214) / dVar200, 1.0 <= dVar206)) {
                          dVar206 = 1.0;
                        }
                      }
                      else {
                        dVar206 = (dVar206 - dVar214) / dVar200;
                        if (1.0 <= dVar206) {
                          dVar206 = 1.0;
                        }
                      }
                      if (2.0 <= dVar206) {
                        dVar206 = 2.0;
                      }
                    }
                    dVar199 = dVar206;
                    if ((short)uVar29 < 0) {
                      cVar146 = '\x05';
                      pdVar122 = pdVar144;
                      dVar199 = dVar214;
                      dVar200 = dVar214;
                      for (lVar119 = -1; lVar119 != 2; lVar119 = lVar119 + 1) {
                        pdVar153 = pdVar122;
                        cVar142 = cVar146;
                        for (lVar120 = -1; lVar120 != 1; lVar120 = lVar120 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            if (((int)lVar134 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                               ((1 << (cVar142 + (char)lVar134 & 0x1fU) & uVar29) != 0)) {
                              dVar202 = pdVar153[lVar134];
                              dVar187 = dVar202;
                              if (dVar202 <= dVar199) {
                                dVar187 = dVar199;
                              }
                              dVar199 = dVar187;
                              if (dVar202 < dVar200) {
                                dVar200 = dVar202;
                              }
                            }
                          }
                          pdVar153 = pdVar153 + lVar34;
                          cVar142 = cVar142 + '\x03';
                        }
                        pdVar122 = pdVar122 + lVar32;
                        cVar146 = cVar146 + '\t';
                      }
                      dVar202 = (((pdVar59 + lVar157 + lVar107 + (lVar132 - lVar171))[lVar62] -
                                 dVar204) * dVar208 +
                                (((pdVar59[lVar157 + lVar107 + (lVar132 - lVar171)] - dVar203) *
                                  dVar195 + dVar214) - (dVar196 + 0.5) * dVar209)) - dVar214;
                      if (dVar202 <= 1e-13) {
                        dVar199 = 1.0;
                        if ((dVar202 < -1e-13) &&
                           (dVar199 = (dVar200 - dVar214) / dVar202, 1.0 <= dVar199)) {
                          dVar199 = 1.0;
                        }
                      }
                      else {
                        dVar199 = (dVar199 - dVar214) / dVar202;
                        if (1.0 <= dVar199) {
                          dVar199 = 1.0;
                        }
                      }
                      if (dVar206 <= dVar199) {
                        dVar199 = dVar206;
                      }
                    }
                    dVar206 = dVar199;
                    if ((uVar29 >> 0x13 & 1) != 0) {
                      cVar146 = '\x06';
                      dVar206 = dVar214;
                      dVar200 = dVar214;
                      for (lVar119 = -1; lVar119 != 2; lVar119 = lVar119 + 1) {
                        cVar142 = cVar146;
                        for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                          for (lVar134 = 0; lVar134 != 2; lVar134 = lVar134 + 1) {
                            dVar202 = dVar200;
                            if ((((int)lVar120 != 0 || (int)lVar119 != 0) || (int)lVar134 != 0) &&
                               ((1 << ((char)lVar134 + cVar142 & 0x1fU) & uVar29) != 0)) {
                              dVar202 = pdVar33[lVar137 + (iVar87 + (int)lVar119) * lVar32 +
                                                          (iVar88 + (int)lVar120) * lVar34 +
                                                          (long)(iVar150 + (int)lVar134)];
                              dVar187 = dVar202;
                              if (dVar202 <= dVar206) {
                                dVar187 = dVar206;
                              }
                              dVar206 = dVar187;
                              if (dVar200 <= dVar202) {
                                dVar202 = dVar200;
                              }
                            }
                            dVar200 = dVar202;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar202 = (((pdVar55 + lVar160 + lVar108 + ((iVar149 - iVar20) + 1))[lVar58] -
                                 dVar204) * dVar208 +
                                (pdVar55[lVar160 + lVar108 + ((iVar149 - iVar20) + 1)] - dVar196) *
                                dVar209 + (0.5 - dVar203) * dVar195 + dVar214) - dVar214;
                      if (dVar202 <= 1e-13) {
                        dVar206 = 1.0;
                        if ((dVar202 < -1e-13) &&
                           (dVar206 = (dVar200 - dVar214) / dVar202, 1.0 <= dVar206)) {
                          dVar206 = 1.0;
                        }
                      }
                      else {
                        dVar206 = (dVar206 - dVar214) / dVar202;
                        if (1.0 <= dVar206) {
                          dVar206 = 1.0;
                        }
                      }
                      if (dVar199 <= dVar206) {
                        dVar206 = dVar199;
                      }
                    }
                    dVar199 = dVar206;
                    if ((uVar29 >> 0x11 & 1) != 0) {
                      cVar146 = '\x05';
                      dVar200 = dVar214;
                      dVar199 = dVar214;
                      for (lVar119 = -1; lVar119 != 2; lVar119 = lVar119 + 1) {
                        cVar142 = cVar146;
                        for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                          for (lVar134 = 0; lVar134 != 2; lVar134 = lVar134 + 1) {
                            dVar202 = dVar200;
                            if (((int)lVar134 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                               ((1 << ((char)lVar134 + cVar142 & 0x1fU) & uVar29) != 0)) {
                              dVar202 = pdVar33[lVar137 + (iVar87 + (int)lVar119) * lVar32 +
                                                          (iVar88 + (int)lVar120) * lVar34 +
                                                          (long)(iVar155 + (int)lVar134)];
                              dVar187 = dVar202;
                              if (dVar202 <= dVar199) {
                                dVar187 = dVar199;
                              }
                              dVar199 = dVar187;
                              if (dVar200 <= dVar202) {
                                dVar202 = dVar200;
                              }
                            }
                            dVar200 = dVar202;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar202 = (((pdVar55 + lVar160 + lVar108 + (lVar132 - iVar20))[lVar58] -
                                 dVar204) * dVar208 +
                                (pdVar55[lVar160 + lVar108 + (lVar132 - iVar20)] - dVar196) *
                                dVar209 + (dVar214 - (dVar203 + 0.5) * dVar195)) - dVar214;
                      if (dVar202 <= 1e-13) {
                        dVar199 = 1.0;
                        if ((dVar202 < -1e-13) &&
                           (dVar199 = (dVar200 - dVar214) / dVar202, 1.0 <= dVar199)) {
                          dVar199 = 1.0;
                        }
                      }
                      else {
                        dVar199 = (dVar199 - dVar214) / dVar202;
                        if (1.0 <= dVar199) {
                          dVar199 = 1.0;
                        }
                      }
                      if (dVar206 <= dVar199) {
                        dVar199 = dVar206;
                      }
                    }
                    dVar206 = dVar199;
                    if ((uVar29 >> 0x1b & 1) != 0) {
                      cVar146 = '\x0e';
                      dVar200 = dVar214;
                      dVar206 = dVar214;
                      for (lVar119 = 0; lVar119 != 2; lVar119 = lVar119 + 1) {
                        cVar142 = cVar146;
                        for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            dVar202 = dVar200;
                            if (((int)lVar134 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                               ((1 << ((char)lVar134 + cVar142 & 0x1fU) & uVar29) != 0)) {
                              dVar202 = pdVar33[lVar137 + (iVar87 + (int)lVar119) * lVar32 +
                                                          (iVar88 + (int)lVar120) * lVar34 +
                                                          (long)(iVar155 + (int)lVar134)];
                              dVar187 = dVar202;
                              if (dVar202 <= dVar206) {
                                dVar187 = dVar206;
                              }
                              dVar206 = dVar187;
                              if (dVar200 <= dVar202) {
                                dVar202 = dVar200;
                              }
                            }
                            dVar200 = dVar202;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar202 = ((0.5 - dVar204) * dVar208 +
                                dVar191 * dVar209 + dVar213 * dVar195 + dVar214) - dVar214;
                      if (dVar202 <= 1e-13) {
                        dVar206 = 1.0;
                        if ((dVar202 < -1e-13) &&
                           (dVar206 = (dVar200 - dVar214) / dVar202, 1.0 <= dVar206)) {
                          dVar206 = 1.0;
                        }
                      }
                      else {
                        dVar206 = (dVar206 - dVar214) / dVar202;
                        if (1.0 <= dVar206) {
                          dVar206 = 1.0;
                        }
                      }
                      if (dVar199 <= dVar206) {
                        dVar206 = dVar199;
                      }
                    }
                    dVar199 = dVar206;
                    if ((uVar29 >> 9 & 1) != 0) {
                      cVar146 = '\x05';
                      dVar200 = dVar214;
                      dVar199 = dVar214;
                      for (lVar119 = -1; lVar119 != 1; lVar119 = lVar119 + 1) {
                        cVar142 = cVar146;
                        for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                          for (lVar134 = 0; lVar134 != 3; lVar134 = lVar134 + 1) {
                            dVar202 = dVar200;
                            if (((int)lVar134 != 1 || ((int)lVar120 != 0 || (int)lVar119 != 0)) &&
                               ((1 << ((char)lVar134 + cVar142 & 0x1fU) & uVar29) != 0)) {
                              dVar202 = pdVar33[lVar137 + (iVar87 + (int)lVar119) * lVar32 +
                                                          (iVar88 + (int)lVar120) * lVar34 +
                                                          (long)(iVar155 + (int)lVar134)];
                              dVar187 = dVar202;
                              if (dVar202 <= dVar199) {
                                dVar187 = dVar199;
                              }
                              dVar199 = dVar187;
                              if (dVar200 <= dVar202) {
                                dVar202 = dVar200;
                              }
                            }
                            dVar200 = dVar202;
                          }
                          cVar142 = cVar142 + '\x03';
                        }
                        cVar146 = cVar146 + '\t';
                      }
                      dVar203 = ((((pdVar63 + lVar113 + lVar133 + (lVar1 - iVar24) * lVar65)[lVar66]
                                  - dVar196) * dVar209 +
                                 (pdVar63[lVar113 + lVar133 + (lVar1 - iVar24) * lVar65] - dVar203)
                                 * dVar195 + dVar214) - (dVar204 + 0.5) * dVar208) - dVar214;
                      if (dVar203 <= 1e-13) {
                        dVar199 = 1.0;
                        if ((dVar203 < -1e-13) &&
                           (dVar199 = (dVar200 - dVar214) / dVar203, 1.0 <= dVar199)) {
                          dVar199 = 1.0;
                        }
                      }
                      else {
                        dVar199 = (dVar199 - dVar214) / dVar203;
                        if (1.0 <= dVar199) {
                          dVar199 = 1.0;
                        }
                      }
                      if (dVar206 <= dVar199) {
                        dVar199 = dVar206;
                      }
                    }
                    dVar203 = 0.0;
                    if (1 < iVar164) {
                      dVar203 = dVar199;
                    }
                    dVar196 = 0.0;
                    if (1 < iVar125) {
                      dVar196 = dVar199;
                    }
                    dVar206 = 0.0;
                    if (1 < iVar174) {
                      dVar206 = dVar199;
                    }
                    if ((local_950 == 1.0) && (!NAN(local_950))) {
                      if ((pdVar50[lVar110 + lVar92 + (int)(iVar149 + ~uVar16)] == 1.0) &&
                         (((!NAN(pdVar50[lVar110 + lVar92 + (int)(iVar149 + ~uVar16)]) &&
                           (pdVar50[lVar110 + lVar92 + (int)((iVar149 - uVar16) + 1)] == 1.0)) &&
                          (!NAN(pdVar50[lVar110 + lVar92 + (int)((iVar149 - uVar16) + 1)]))))) {
                        dVar203 = 1.0;
                      }
                      if (((pdVar50[lVar162 + lVar92 + lVar140] == 1.0) &&
                          (!NAN(pdVar50[lVar162 + lVar92 + lVar140]))) &&
                         ((pdVar50[lVar165 + lVar92 + lVar140] == 1.0 &&
                          (!NAN(pdVar50[lVar165 + lVar92 + lVar140]))))) {
                        dVar196 = 1.0;
                      }
                      if (((dVar192 == 1.0) && (!NAN(dVar192))) &&
                         ((pdVar50[lVar110 + lVar140 + lVar105] == 1.0 &&
                          (!NAN(pdVar50[lVar110 + lVar140 + lVar105]))))) {
                        dVar206 = 1.0;
                      }
                    }
                    dVar192 = (0.5 - dVar204) * dVar208 * dVar206 +
                              dVar191 * dVar209 * dVar196 + dVar213 * dVar195 * dVar203 + dVar214;
                    if (dVar192 <= dVar215) {
                      dVar215 = dVar192;
                    }
                    if (dVar212 <= dVar215) {
                      dVar212 = dVar215;
                    }
                    dVar212 = pdVar36[lVar138 + lVar112 + (lVar132 - lVar156)] * dVar185 * -0.5 *
                              dVar208 * dVar206 + dVar212;
                  }
                  else {
                    dVar210 = pdVar50[lVar110 + lVar140 + lVar94];
                    if (((pdVar50[lVar110 + lVar140 + lVar93] != 1.0) ||
                        (NAN(pdVar50[lVar110 + lVar140 + lVar93]))) ||
                       ((dVar210 != 1.0 || (NAN(dVar210))))) {
                      if ((dVar210 != 1.0) || (NAN(dVar210))) goto LAB_0040b69a;
                    }
                    else if ((pdVar50[lVar110 + lVar140 + ((lVar130 + 2) - lVar169) * lVar52] == 1.0
                             ) && (!NAN(pdVar50[lVar110 + lVar140 + ((lVar130 + 2) - lVar169) *
                                                                    lVar52]))) {
                      lVar120 = lVar132 - lVar183;
                      dVar210 = pdVar33[lVar111 + lVar120 + lVar95 + lVar137];
                      dVar191 = dVar210 - pdVar33[lVar111 + lVar120 + lVar96 + lVar137];
                      dVar204 = pdVar33[lVar111 + lVar120 + lVar96 + lVar137] -
                                pdVar33[lVar111 + lVar120 + lVar98 + lVar137];
                      dVar212 = 0.0;
                      dVar213 = 0.0;
                      if (0.0 <= dVar191 * dVar204) {
                        dVar213 = ABS(dVar191);
                        if (ABS(dVar204) <= ABS(dVar191)) {
                          dVar213 = ABS(dVar204);
                        }
                        dVar213 = dVar213 + dVar213;
                      }
                      dVar196 = pdVar33[lVar111 + lVar120 + ((lVar130 + 2) - lVar182) * lVar32 +
                                                            lVar137] -
                                pdVar33[lVar111 + lVar120 + lVar97 + lVar137];
                      dVar206 = pdVar33[lVar111 + lVar120 + lVar97 + lVar137] - dVar210;
                      dVar203 = (dVar206 + dVar196) * 0.5;
                      if (0.0 <= dVar206 * dVar196) {
                        dVar212 = ABS(dVar196);
                        if (ABS(dVar206) <= ABS(dVar196)) {
                          dVar212 = ABS(dVar206);
                        }
                        dVar212 = dVar212 + dVar212;
                      }
                      dVar214 = (dVar191 + dVar206) * 0.5;
                      dVar196 = 0.0;
                      if (0.0 <= dVar191 * dVar206) {
                        dVar196 = ABS(dVar206);
                        if (ABS(dVar191) <= ABS(dVar206)) {
                          dVar196 = ABS(dVar191);
                        }
                        dVar196 = dVar196 + dVar196;
                      }
                      dVar204 = (dVar191 + dVar204) * 0.5;
                      dVar191 = ABS(dVar204);
                      if (dVar213 <= dVar191) {
                        dVar191 = dVar213;
                      }
                      dVar213 = ABS(dVar203);
                      if (dVar212 <= dVar213) {
                        dVar213 = dVar212;
                      }
                      dVar212 = ABS(dVar214 * 1.3333333333333333 +
                                    (dVar213 * (double)((ulong)dVar203 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar191 * (double)((ulong)dVar204 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar196 <= dVar212) {
                        dVar212 = dVar196;
                      }
                      dVar210 = dVar212 * (double)((ulong)dVar214 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (-1.0 - pdVar36[lVar138 + lVar112 + (lVar132 - lVar156)] * dVar185)
                                * 0.5 + dVar210;
                      goto LAB_0040ceff;
                    }
                    lVar120 = lVar132 - lVar183;
                    dVar210 = pdVar33[lVar111 + lVar120 + lVar95 + lVar137];
                    dVar204 = dVar210 - pdVar33[lVar111 + lVar120 + lVar96 + lVar137];
                    dVar203 = pdVar33[lVar111 + lVar120 + lVar97 + lVar137] - dVar210;
                    dVar204 = dVar204 + dVar204;
                    dVar203 = dVar203 + dVar203;
                    dVar212 = (pdVar33[lVar111 + lVar120 + lVar97 + lVar137] -
                              pdVar33[lVar111 + lVar120 + lVar96 + lVar137]) * 0.5;
                    dVar191 = ABS(dVar204);
                    uVar184 = -(ulong)(0.0 < dVar212);
                    dVar212 = ABS(dVar212);
                    dVar213 = ABS(dVar203);
                    if (dVar191 <= dVar212) {
                      dVar212 = dVar191;
                    }
                    if (dVar212 <= dVar213) {
                      dVar213 = dVar212;
                    }
                    uVar189 = -(ulong)(0.0 < dVar204 * dVar203) & (ulong)dVar213;
                    dVar210 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) | uVar184 & uVar189
                                      ) *
                              (-1.0 - pdVar36[lVar138 + lVar112 + (lVar132 - lVar156)] * dVar185) *
                              0.5 + dVar210;
LAB_0040ceff:
                    dVar212 = pdVar50[lVar110 + lVar140 + lVar105];
                    if ((((((dVar212 != 1.0) || (NAN(dVar212))) || (dVar192 != 1.0)) ||
                         ((NAN(dVar192) ||
                          (pdVar50[lVar110 + lVar140 + ((iVar124 + -3) - iVar18) * lVar52] != 1.0)))
                         ) || (NAN(pdVar50[lVar110 + lVar140 + ((iVar124 + -3) - iVar18) * lVar52]))
                        ) || ((pdVar50[lVar110 + lVar140 + lVar104] != 1.0 ||
                              (NAN(pdVar50[lVar110 + lVar140 + lVar104]))))) {
                      if ((dVar192 != 1.0) ||
                         (((NAN(dVar192) || (dVar212 != 1.0)) || (NAN(dVar212))))) {
                        iVar150 = iVar149 - iVar4;
                        lVar134 = (long)iVar150;
                        lVar133 = lVar132 - lVar173;
                        bVar81 = true;
                        local_950 = 1.0;
                        goto LAB_0040d30a;
                      }
                      lVar119 = lVar132 - lVar183;
                      dVar192 = pdVar33[lVar111 + lVar119 + lVar96 + lVar137];
                      dVar191 = dVar192 - pdVar33[lVar111 + lVar119 + lVar151 + lVar137];
                      dVar204 = pdVar33[lVar111 + lVar119 + lVar95 + lVar137] - dVar192;
                      dVar191 = dVar191 + dVar191;
                      dVar204 = dVar204 + dVar204;
                      dVar213 = (pdVar33[lVar111 + lVar119 + lVar95 + lVar137] -
                                pdVar33[lVar111 + lVar119 + lVar151 + lVar137]) * 0.5;
                      dVar203 = ABS(dVar191);
                      uVar184 = -(ulong)(0.0 < dVar213);
                      dVar213 = ABS(dVar213);
                      dVar212 = ABS(dVar204);
                      if (dVar203 <= dVar213) {
                        dVar213 = dVar203;
                      }
                      if (dVar213 <= dVar212) {
                        dVar212 = dVar213;
                      }
                      uVar189 = -(ulong)(0.0 < dVar191 * dVar204) & (ulong)dVar212;
                      dVar212 = (double)(~uVar184 & (uVar189 ^ 0x8000000000000000) |
                                        uVar184 & uVar189) *
                                (1.0 - pdVar36[lVar138 + lVar112 + (lVar132 - lVar156)] * dVar185) *
                                0.5;
                    }
                    else {
                      lVar119 = lVar132 - lVar183;
                      dVar192 = pdVar33[lVar111 + lVar119 + lVar96 + lVar137];
                      dVar191 = dVar192 - pdVar33[lVar111 + lVar119 + lVar151 + lVar137];
                      dVar204 = pdVar33[lVar111 + lVar119 + lVar151 + lVar137] -
                                pdVar33[lVar111 + lVar119 + ((iVar124 + -3) - iVar167) * lVar32 +
                                                            lVar137];
                      dVar213 = 0.0;
                      dVar212 = 0.0;
                      if (0.0 <= dVar191 * dVar204) {
                        dVar212 = ABS(dVar191);
                        if (ABS(dVar204) <= ABS(dVar191)) {
                          dVar212 = ABS(dVar204);
                        }
                        dVar212 = dVar212 + dVar212;
                      }
                      dVar203 = pdVar33[lVar111 + lVar119 + (iVar158 - iVar167) * lVar32 + lVar137]
                                - pdVar33[lVar111 + lVar119 + lVar95 + lVar137];
                      dVar206 = pdVar33[lVar111 + lVar119 + lVar95 + lVar137] - dVar192;
                      dVar196 = (dVar206 + dVar203) * 0.5;
                      if (0.0 <= dVar206 * dVar203) {
                        dVar213 = ABS(dVar203);
                        if (ABS(dVar206) <= ABS(dVar203)) {
                          dVar213 = ABS(dVar206);
                        }
                        dVar213 = dVar213 + dVar213;
                      }
                      dVar214 = (dVar191 + dVar206) * 0.5;
                      dVar203 = 0.0;
                      if (0.0 <= dVar191 * dVar206) {
                        dVar203 = ABS(dVar206);
                        if (ABS(dVar191) <= ABS(dVar206)) {
                          dVar203 = ABS(dVar191);
                        }
                        dVar203 = dVar203 + dVar203;
                      }
                      dVar204 = (dVar191 + dVar204) * 0.5;
                      dVar191 = ABS(dVar204);
                      if (dVar212 <= dVar191) {
                        dVar191 = dVar212;
                      }
                      dVar212 = ABS(dVar196);
                      if (dVar213 <= dVar212) {
                        dVar212 = dVar213;
                      }
                      dVar212 = ABS(dVar214 * 1.3333333333333333 +
                                    (dVar212 * (double)((ulong)dVar196 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar191 * (double)((ulong)dVar204 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar203 <= dVar212) {
                        dVar212 = dVar203;
                      }
                      dVar212 = dVar212 * (double)((ulong)dVar214 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (1.0 - pdVar36[lVar138 + lVar112 + (lVar132 - lVar156)] * dVar185) *
                                0.5;
                    }
                    dVar212 = dVar212 + dVar192;
                  }
                }
                pdVar43[uVar135 * lVar46 +
                        (int)(~uVar14 + iVar124) * lVar45 + lVar117 * lVar44 + (lVar132 - iVar12)] =
                     dVar212;
                pdVar39[uVar135 * lVar42 +
                        (lVar130 - iVar11) * lVar41 + lVar118 * lVar40 + (lVar132 - iVar9)] =
                     dVar210;
                lVar132 = lVar132 + 1;
                local_7c8 = local_7c8 + 1;
                local_7d0 = local_7d0 + 1;
                local_7c0 = local_7c0 + 1;
                iVar80 = iVar80 + 1;
                iVar79 = iVar79 + 1;
                pdVar144 = pdVar144 + 1;
                lVar119 = lVar3;
              } while (iVar26 + 1 != (int)lVar132);
            }
          }
          local_880 = local_880 + lVar31;
          local_878 = local_878 + lVar31;
          local_870 = local_870 + lVar31;
          local_8f8 = local_8f8 + lVar32;
          lVar130 = lVar2;
        }
        uVar135 = uVar135 + 1;
        local_8b0 = local_8b0 + lVar35;
      } while( true );
    }
  }
  else {
    iVar7 = (zebox->bigend).vect[0];
  }
  A[0][0] = (Real)q->p;
  A[0][1] = (Real)q->jstride;
  A[0][2] = (Real)q->kstride;
  A[1][0] = (Real)q->nstride;
  A[1][1] = *(Real *)&q->begin;
  uVar67 = *(undefined8 *)&(q->begin).z;
  uVar68 = (q->end).y;
  A[2]._4_8_ = *(undefined8 *)&(q->end).z;
  A[1][2]._0_4_ = (undefined4)uVar67;
  A[1][2]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[2][2] = (Real)wmac->p;
  A[3][0] = (Real)wmac->jstride;
  A[3][1] = (Real)wmac->kstride;
  A[3][2] = (Real)wmac->nstride;
  A[4][0] = *(Real *)&wmac->begin;
  uVar69 = (wmac->end).x;
  uVar70 = (wmac->end).y;
  A._116_8_ = *(undefined8 *)&(wmac->end).z;
  A[4][1]._0_4_ = (undefined4)*(undefined8 *)&(wmac->begin).z;
  A[6][1] = (Real)Imz->p;
  A[6][2] = (Real)Imz->jstride;
  A[7][0] = (Real)Imz->kstride;
  A[7][1] = (Real)Imz->nstride;
  A[7][2] = *(Real *)&Imz->begin;
  uVar67 = *(undefined8 *)&(Imz->begin).z;
  uVar71 = (Imz->end).y;
  A[8]._12_8_ = *(undefined8 *)&(Imz->end).z;
  A[8][0]._0_4_ = (undefined4)uVar67;
  A[8][0]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[9][0] = (Real)Ipz->p;
  A[9][1] = (Real)Ipz->jstride;
  A[9][2] = (Real)Ipz->kstride;
  A[10][0] = (Real)Ipz->nstride;
  A[10][1] = *(Real *)&Ipz->begin;
  uVar72 = (Ipz->end).x;
  uVar73 = (Ipz->end).y;
  A[0xb]._4_8_ = *(undefined8 *)&(Ipz->end).z;
  A[10][2]._0_4_ = (undefined4)*(undefined8 *)&(Ipz->begin).z;
  A[0xc][0] = (Real)pbc;
  A[0xc][1] = (Real)flag->p;
  A[0xc][2] = (Real)flag->jstride;
  A[0xd][0] = (Real)flag->kstride;
  A[0xd][1] = (Real)flag->nstride;
  A[0xd][2] = *(Real *)&flag->begin;
  uVar67 = *(undefined8 *)&(flag->begin).z;
  uVar74 = (flag->end).y;
  A[0xe]._12_8_ = *(undefined8 *)&(flag->end).z;
  A[0xe][0]._0_4_ = (undefined4)uVar67;
  A[0xe][0]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[0xf][0] = (Real)vfrac->p;
  A[0xf][1] = (Real)vfrac->jstride;
  A[0xf][2] = (Real)vfrac->kstride;
  A[0x10][0] = (Real)vfrac->nstride;
  A[0x10][1] = *(Real *)&vfrac->begin;
  uVar67 = *(undefined8 *)&(vfrac->begin).z;
  uVar75 = (vfrac->end).y;
  A[0x11]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x10][2]._0_4_ = (undefined4)uVar67;
  A[0x10][2]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[0x11][2] = (Real)ccc->p;
  A[0x12][0] = (Real)ccc->jstride;
  A[0x12][1] = (Real)ccc->kstride;
  A[0x12][2] = (Real)ccc->nstride;
  A[0x13][0] = *(Real *)&ccc->begin;
  uVar67 = *(undefined8 *)&(ccc->begin).z;
  uVar76 = (ccc->end).y;
  A._476_8_ = *(undefined8 *)&(ccc->end).z;
  A[0x13][1]._0_4_ = (undefined4)uVar67;
  A[0x13][1]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[0x14][1] = (Real)fcx->p;
  A[0x14][2] = (Real)fcx->jstride;
  A[0x15][0] = (Real)fcx->kstride;
  A[0x15][1] = (Real)fcx->nstride;
  A[0x15][2] = *(Real *)&fcx->begin;
  uVar67 = *(undefined8 *)&(fcx->begin).z;
  uVar77 = (fcx->end).y;
  A[0x16]._12_8_ = *(undefined8 *)&(fcx->end).z;
  A[0x16][0]._0_4_ = (undefined4)uVar67;
  A[0x16][0]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[0x17][0] = (Real)fcy->p;
  A[0x17][1] = (Real)fcy->jstride;
  A[0x17][2] = (Real)fcy->kstride;
  A[0x18][0] = (Real)fcy->nstride;
  A[0x18][1] = *(Real *)&fcy->begin;
  uVar67 = *(undefined8 *)&(fcy->begin).z;
  uVar78 = (fcy->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(fcy->end).z;
  A[0x18][2]._0_4_ = (undefined4)uVar67;
  A[0x18][2]._4_4_ = (undefined4)((ulong)uVar67 >> 0x20);
  A[0x19][2] = (Real)fcz->p;
  A[0x1a][0] = (Real)fcz->jstride;
  A[0x1a][1] = (Real)fcz->kstride;
  A[0x1a][2] = (Real)fcz->nstride;
  iVar9 = (zebox->smallend).vect[0];
  iVar10 = (zebox->smallend).vect[1];
  iVar11 = (zebox->smallend).vect[2];
  iVar12 = (zebox->bigend).vect[1];
  iVar13 = (zebox->bigend).vect[2];
  iVar145 = 0;
  if (ncomp < 1) {
    ncomp = 0;
  }
  A[2][0]._0_4_ = uVar68;
  A[4][1]._4_4_ = uVar69;
  A[4][2]._0_4_ = uVar70;
  A[5][1]._0_4_ = iVar179;
  A[5][1]._4_4_ = iVar181;
  A[5][2]._0_4_ = iVar5;
  A[5][2]._4_4_ = iVar167;
  A[6][0]._0_4_ = iVar4;
  A[6][0]._4_4_ = iVar6;
  A[8][1]._0_4_ = uVar71;
  A[10][2]._4_4_ = uVar72;
  A[0xb][0]._0_4_ = uVar73;
  A[0xb][2] = dVar185;
  A[0xe][1]._0_4_ = uVar74;
  A[0x11][0]._0_4_ = uVar75;
  A[0x13][2]._0_4_ = uVar76;
  A[0x16][1]._0_4_ = uVar77;
  A[0x19][0]._0_4_ = uVar78;
  for (; iVar179 = iVar11, iVar145 != ncomp; iVar145 = iVar145 + 1) {
    for (; iVar181 = iVar10, iVar179 <= iVar13; iVar179 = iVar179 + 1) {
      for (; iVar181 <= iVar12; iVar181 = iVar181 + 1) {
        iVar167 = iVar9;
        if (iVar9 <= iVar7) {
          do {
            PredictStateOnZFace::anon_class_688_19_da5fa63c::operator()
                      ((anon_class_688_19_da5fa63c *)A,iVar167,iVar181,iVar179,iVar145);
            iVar167 = iVar167 + 1;
          } while (iVar7 + 1 != iVar167);
        }
      }
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnZFace ( Box const& zebox, int ncomp,
                             Array4<Real> const& Imz, Array4<Real> const& Ipz,
                             Array4<Real const> const& q,
                             Array4<Real const> const& wmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dz = geom.CellSize(1);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qpls = q(i,j,k-1,n);

                // Over-write all with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    qmns = q(i,j,k-1,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qmns = q(i,j,k,n);
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dt,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}